

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

AssertionResult __thiscall
testing::internal::DoubleNearPredFormat
          (internal *this,char *expr1,char *expr2,char *abs_error_expr,double val1,double val2,
          double abs_error)

{
  double __x;
  bool bVar1;
  bool bVar2;
  uint uVar3;
  double *pdVar4;
  AssertionResult *pAVar5;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var6;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  double __y;
  AssertionResult AVar7;
  AssertionResult local_98 [2];
  AssertionResult local_78;
  double local_68;
  double epsilon;
  double local_58;
  double local_50;
  double min_abs;
  double diff;
  double abs_error_local;
  double val2_local;
  double val1_local;
  char *abs_error_expr_local;
  char *expr2_local;
  char *expr1_local;
  
  diff = abs_error;
  abs_error_local = val2;
  val2_local = val1;
  val1_local = (double)abs_error_expr;
  abs_error_expr_local = expr2;
  expr2_local = expr1;
  expr1_local = (char *)this;
  uVar3 = std::isinf(val1);
  if (((uVar3 & 1) != 0) && (uVar3 = std::isinf(abs_error_local), (uVar3 & 1) != 0)) {
    bVar1 = std::signbit(val2_local);
    bVar2 = std::signbit(abs_error_local);
    if ((bVar1 == bVar2) || ((0.0 < diff && (uVar3 = std::isinf(diff), (uVar3 & 1) != 0)))) {
      AVar7 = AssertionSuccess();
      _Var6._M_head_impl =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AVar7.message_._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
      goto LAB_00158375;
    }
  }
  min_abs = ABS(val2_local - abs_error_local);
  if (diff < min_abs) {
    local_58 = ABS(val2_local);
    epsilon = ABS(abs_error_local);
    pdVar4 = std::min<double>(&local_58,&epsilon);
    __x = *pdVar4;
    local_50 = __x;
    __y = std::numeric_limits<double>::infinity();
    local_68 = nextafter(__x,__y);
    local_68 = local_68 - local_50;
    uVar3 = std::isnan(val2_local);
    if (((((uVar3 & 1) != 0) || (uVar3 = std::isnan(abs_error_local), (uVar3 & 1) != 0)) ||
        (diff <= 0.0)) || (local_68 <= diff)) {
      AssertionFailure();
      pAVar5 = AssertionResult::operator<<(local_98,(char (*) [24])"The difference between ");
      pAVar5 = AssertionResult::operator<<(pAVar5,&expr2_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [6])" and ");
      pAVar5 = AssertionResult::operator<<(pAVar5,&abs_error_expr_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [5])0x1d6c15);
      pAVar5 = AssertionResult::operator<<(pAVar5,&min_abs);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [17])", which exceeds ");
      pAVar5 = AssertionResult::operator<<(pAVar5,(char **)&val1_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [9])", where\n");
      pAVar5 = AssertionResult::operator<<(pAVar5,&expr2_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [15])" evaluates to ");
      pAVar5 = AssertionResult::operator<<(pAVar5,&val2_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [3])0x1d76d8);
      pAVar5 = AssertionResult::operator<<(pAVar5,&abs_error_expr_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [15])" evaluates to ");
      pAVar5 = AssertionResult::operator<<(pAVar5,&abs_error_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [7])", and\n");
      pAVar5 = AssertionResult::operator<<(pAVar5,(char **)&val1_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [15])" evaluates to ");
      pAVar5 = AssertionResult::operator<<(pAVar5,&diff);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [2])0x1d7684);
      AssertionResult::AssertionResult((AssertionResult *)this,pAVar5);
      AssertionResult::~AssertionResult(local_98);
      _Var6._M_head_impl = extraout_RDX_00;
    }
    else {
      AssertionFailure();
      pAVar5 = AssertionResult::operator<<(&local_78,(char (*) [24])"The difference between ");
      pAVar5 = AssertionResult::operator<<(pAVar5,&expr2_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [6])" and ");
      pAVar5 = AssertionResult::operator<<(pAVar5,&abs_error_expr_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [5])0x1d6c15);
      pAVar5 = AssertionResult::operator<<(pAVar5,&min_abs);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [9])", where\n");
      pAVar5 = AssertionResult::operator<<(pAVar5,&expr2_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [15])" evaluates to ");
      pAVar5 = AssertionResult::operator<<(pAVar5,&val2_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [3])0x1d76d8);
      pAVar5 = AssertionResult::operator<<(pAVar5,&abs_error_expr_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [15])" evaluates to ");
      pAVar5 = AssertionResult::operator<<(pAVar5,&abs_error_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [27])".\nThe abs_error parameter ");
      pAVar5 = AssertionResult::operator<<(pAVar5,(char **)&val1_local);
      pAVar5 = AssertionResult::operator<<(pAVar5,(char (*) [15])" evaluates to ");
      pAVar5 = AssertionResult::operator<<(pAVar5,&diff);
      pAVar5 = AssertionResult::operator<<
                         (pAVar5,(char (*) [100])
                                 " which is smaller than the minimum distance between doubles for numbers of this magnitude which is "
                         );
      pAVar5 = AssertionResult::operator<<(pAVar5,&local_68);
      pAVar5 = AssertionResult::operator<<
                         (pAVar5,(char (*) [106])
                                 ", thus making this EXPECT_NEAR check equivalent to EXPECT_EQUAL. Consider using EXPECT_DOUBLE_EQ instead."
                         );
      AssertionResult::AssertionResult((AssertionResult *)this,pAVar5);
      AssertionResult::~AssertionResult(&local_78);
      _Var6 = extraout_RDX.
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl;
    }
  }
  else {
    AVar7 = AssertionSuccess();
    _Var6._M_head_impl =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         AVar7.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
  }
LAB_00158375:
  AVar7.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )_Var6._M_head_impl;
  AVar7._0_8_ = this;
  return AVar7;
}

Assistant:

AssertionResult DoubleNearPredFormat(const char* expr1, const char* expr2,
                                     const char* abs_error_expr, double val1,
                                     double val2, double abs_error) {
  // We want to return success when the two values are infinity and at least
  // one of the following is true:
  //  * The values are the same-signed infinity.
  //  * The error limit itself is infinity.
  // This is done here so that we don't end up with a NaN when calculating the
  // difference in values.
  if (std::isinf(val1) && std::isinf(val2) &&
      (std::signbit(val1) == std::signbit(val2) ||
       (abs_error > 0.0 && std::isinf(abs_error)))) {
    return AssertionSuccess();
  }

  const double diff = fabs(val1 - val2);
  if (diff <= abs_error) return AssertionSuccess();

  // Find the value which is closest to zero.
  const double min_abs = std::min(fabs(val1), fabs(val2));
  // Find the distance to the next double from that value.
  const double epsilon =
      nextafter(min_abs, std::numeric_limits<double>::infinity()) - min_abs;
  // Detect the case where abs_error is so small that EXPECT_NEAR is
  // effectively the same as EXPECT_EQUAL, and give an informative error
  // message so that the situation can be more easily understood without
  // requiring exotic floating-point knowledge.
  // Don't do an epsilon check if abs_error is zero because that implies
  // that an equality check was actually intended.
  if (!(std::isnan)(val1) && !(std::isnan)(val2) && abs_error > 0 &&
      abs_error < epsilon) {
    return AssertionFailure()
           << "The difference between " << expr1 << " and " << expr2 << " is "
           << diff << ", where\n"
           << expr1 << " evaluates to " << val1 << ",\n"
           << expr2 << " evaluates to " << val2 << ".\nThe abs_error parameter "
           << abs_error_expr << " evaluates to " << abs_error
           << " which is smaller than the minimum distance between doubles for "
              "numbers of this magnitude which is "
           << epsilon
           << ", thus making this EXPECT_NEAR check equivalent to "
              "EXPECT_EQUAL. Consider using EXPECT_DOUBLE_EQ instead.";
  }
  return AssertionFailure()
         << "The difference between " << expr1 << " and " << expr2 << " is "
         << diff << ", which exceeds " << abs_error_expr << ", where\n"
         << expr1 << " evaluates to " << val1 << ",\n"
         << expr2 << " evaluates to " << val2 << ", and\n"
         << abs_error_expr << " evaluates to " << abs_error << ".";
}